

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  IdxElement *pIVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  IdxElement tmp;
  
  if (start + 1 < end) {
    uVar13 = end - 1;
    uVar10 = uVar13 - start;
    if (0x18 < (int)uVar10) {
LAB_0022f816:
      iVar11 = (uVar10 >> 1) + start;
      pIVar1 = keys + iVar11;
      dVar4 = keys[iVar11].val;
      lVar14 = (long)start;
      lVar16 = -(long)(int)uVar13;
      uVar10 = uVar13;
      uVar18 = start;
      do {
        uVar12 = (ulong)uVar10;
        uVar19 = uVar18;
        if ((type & 1U) == 0) {
          if ((int)uVar18 < (int)uVar13) {
            pdVar15 = &keys[(int)uVar18].val;
            lVar17 = 0;
            do {
              dVar5 = *pdVar15;
              if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (0.0 < dVar4 - dVar5)) {
                uVar19 = uVar18 - (int)lVar17;
                break;
              }
              lVar17 = lVar17 + -1;
              pdVar15 = pdVar15 + 2;
              uVar19 = uVar13;
            } while (lVar16 + (int)uVar18 != lVar17);
          }
          if (start < (int)uVar10) {
            uVar12 = (ulong)(int)uVar10;
            pdVar15 = &keys[uVar12].val;
            do {
              if (dVar4 < *pdVar15 || dVar4 == *pdVar15) goto LAB_0022f91d;
              uVar12 = uVar12 - 1;
              pdVar15 = pdVar15 + -2;
            } while (lVar14 < (long)uVar12);
            goto LAB_0022f91b;
          }
        }
        else {
          if ((int)uVar18 < (int)uVar13) {
            pdVar15 = &keys[(int)uVar18].val;
            lVar17 = 0;
            do {
              if (*pdVar15 <= dVar4) {
                uVar19 = uVar18 - (int)lVar17;
                break;
              }
              lVar17 = lVar17 + -1;
              pdVar15 = pdVar15 + 2;
              uVar19 = uVar13;
            } while (lVar16 + (int)uVar18 != lVar17);
          }
          if (start < (int)uVar10) {
            uVar12 = (ulong)(int)uVar10;
            pdVar15 = &keys[uVar12].val;
            do {
              dVar5 = *pdVar15;
              if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (dVar4 - dVar5 < 0.0))
              goto LAB_0022f91d;
              uVar12 = uVar12 - 1;
              pdVar15 = pdVar15 + -2;
            } while (lVar14 < (long)uVar12);
LAB_0022f91b:
            uVar12 = (ulong)(uint)start;
          }
        }
LAB_0022f91d:
        uVar10 = (uint)uVar12;
        if ((int)uVar10 <= (int)uVar19) goto LAB_0022f958;
        pIVar2 = keys + (int)uVar19;
        iVar11 = pIVar2->idx;
        uVar9 = *(undefined4 *)&pIVar2->field_0x4;
        dVar5 = pIVar2->val;
        pIVar2 = keys + (int)uVar10;
        uVar8 = *(undefined4 *)&pIVar2->field_0x4;
        dVar7 = pIVar2->val;
        pIVar3 = keys + (int)uVar19;
        pIVar3->idx = pIVar2->idx;
        *(undefined4 *)&pIVar3->field_0x4 = uVar8;
        pIVar3->val = dVar7;
        pIVar2 = keys + (int)uVar10;
        pIVar2->idx = iVar11;
        *(undefined4 *)&pIVar2->field_0x4 = uVar9;
        pIVar2->val = dVar5;
        uVar18 = uVar19 + 1;
        uVar10 = uVar10 - 1;
      } while( true );
    }
LAB_0022fa8b:
    if (0 < (int)uVar10) {
      SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                (keys,uVar13,compare,start);
      return;
    }
  }
  return;
LAB_0022f958:
  if ((type & 1U) == 0) {
    if (start < (int)uVar10) {
      uVar12 = (ulong)(int)uVar10;
      pdVar15 = &keys[uVar12].val;
      do {
        dVar5 = *pdVar15;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (0.0 < dVar5 - dVar4))
        goto LAB_0022f9d6;
        uVar12 = uVar12 - 1;
        pdVar15 = pdVar15 + -2;
      } while (lVar14 < (long)uVar12);
      uVar12 = (ulong)(uint)start;
    }
LAB_0022f9d6:
    uVar10 = (uint)uVar12;
    if (uVar10 == uVar13) {
      pIVar2 = keys + (int)uVar10;
      iVar11 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + (int)uVar10;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar11;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      uVar10 = uVar10 - 1;
    }
  }
  else {
    uVar18 = uVar19;
    if ((int)uVar19 < (int)uVar13) {
      pdVar15 = &keys[(int)uVar19].val;
      lVar14 = 0;
      do {
        dVar5 = *pdVar15;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (dVar5 - dVar4 < 0.0)) {
          uVar18 = uVar19 - (int)lVar14;
          break;
        }
        lVar14 = lVar14 + -1;
        pdVar15 = pdVar15 + 2;
        uVar18 = uVar13;
      } while ((long)(int)uVar19 - (long)(int)uVar13 != lVar14);
    }
    uVar19 = uVar18;
    if (uVar19 == start) {
      pIVar2 = keys + (int)uVar19;
      iVar11 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + (int)uVar19;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar11;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      uVar19 = uVar19 + 1;
    }
  }
  if ((int)(uVar13 - uVar19) < (int)(uVar10 - start)) {
    bVar6 = (int)uVar13 <= (int)uVar19;
    uVar18 = uVar10;
    uVar10 = uVar13;
    uVar13 = uVar19;
    uVar19 = start;
    if (bVar6) goto LAB_0022fa71;
  }
  else {
    bVar6 = (int)uVar10 <= start;
    uVar18 = uVar13;
    uVar13 = start;
    start = uVar19;
    if (bVar6) goto LAB_0022fa71;
  }
  SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
            (keys,uVar10 + 1,compare,uVar13,(bool)(~type & 1));
  start = uVar19;
LAB_0022fa71:
  uVar13 = uVar18;
  type = (bool)(type ^ 1);
  uVar10 = uVar13 - start;
  if ((int)uVar10 < 0x19) goto LAB_0022fa8b;
  goto LAB_0022f816;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}